

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doGetUsedFuncs(DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                 *this,FuncSet *dst)

{
  size_type sVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement> *this_00;
  Statement *this_01;
  ExprBase *this_02;
  pair<std::_Rb_tree_const_iterator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_bool> pVar2
  ;
  ulong local_48;
  size_t ndx;
  DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_30;
  _Base_ptr local_28;
  undefined1 local_20;
  set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  *local_18;
  FuncSet *dst_local;
  DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  local_18 = dst;
  dst_local = (FuncSet *)this;
  initialize(this);
  local_30 = this;
  pVar2 = std::
          set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
          ::insert(local_18,(value_type *)&local_30);
  local_28 = (_Base_ptr)pVar2.first._M_node;
  local_20 = pVar2.second;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_48 = 0;
    while( true ) {
      sVar1 = std::
              vector<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
              ::size(&this->m_body);
      if (sVar1 <= local_48) break;
      this_00 = &std::
                 vector<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
                 ::operator[](&this->m_body,local_48)->
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>;
      this_01 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>::operator->
                          (this_00);
      Statement::getUsedFuncs(this_01,local_18);
      local_48 = local_48 + 1;
    }
    this_02 = &de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>
               ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>
                             *)&this->m_ret)->super_ExprBase;
    ExprBase::getUsedFuncs(this_02,local_18);
  }
  return;
}

Assistant:

void						doGetUsedFuncs	(FuncSet& dst) const
	{
		initialize();
		if (dst.insert(this).second)
		{
			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->getUsedFuncs(dst);
			m_ret->getUsedFuncs(dst);
		}
	}